

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

void __thiscall Problem_CGBG_FF::~Problem_CGBG_FF(Problem_CGBG_FF *this)

{
  undefined8 *in_RDI;
  vector<Scope,_std::allocator<Scope>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Problem_CGBG_FF_00d0d628;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)unaff_retaddr);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(unaff_retaddr);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(unaff_retaddr);
  std::
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
  ::~map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
          *)0x8ed555);
  Scope::~Scope((Scope *)0x8ed566);
  BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical
            (&this->super_BayesianGameCollaborativeGraphical);
  return;
}

Assistant:

Problem_CGBG_FF::~Problem_CGBG_FF()
{
}